

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_tx(tftp_state_data *state,tftp_event_t event)

{
  unsigned_short uVar1;
  Curl_easy *data;
  curl_trc_feat *pcVar2;
  ushort uVar3;
  CURLcode CVar4;
  time_t tVar5;
  ssize_t sVar6;
  int *piVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  curl_off_t size;
  uchar *buf;
  _Bool eos;
  size_t cb;
  char buffer [256];
  
  data = state->data;
  switch(event) {
  case TFTP_EVENT_ACK:
    uVar3 = *(ushort *)((state->rpacket).data + 2);
    uVar3 = uVar3 << 8 | uVar3 >> 8;
    if ((uVar3 != state->block) && ((state->block != 0 || (uVar3 != 0xffff)))) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"Received ACK for block %d, expecting %d",(ulong)uVar3);
      }
      iVar9 = state->retries;
      state->retries = iVar9 + 1;
      if (state->retry_max <= iVar9) {
        Curl_failf(data,"tftp_tx: giving up waiting for block %d ack",(ulong)state->block);
        return CURLE_SEND_ERROR;
      }
      sVar6 = sendto(state->sockfd,(state->spacket).data,(long)state->sbytes + 4,0x4000,
                     (sockaddr *)&state->remote_addr,state->remote_addrlen);
      if (-1 < sVar6) {
        return CURLE_OK;
      }
      goto LAB_00157a6e;
    }
    tVar5 = time((time_t *)0x0);
    state->rx_time = tVar5;
    state->block = state->block + 1;
    break;
  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    *(state->spacket).data = '\0';
    (state->spacket).data[1] = '\x05';
    uVar1 = state->block;
    (state->spacket).data[2] = (uchar)(uVar1 >> 8);
    (state->spacket).data[3] = (uchar)uVar1;
    sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
           state->remote_addrlen);
    state->state = TFTP_STATE_FIN;
    return CURLE_OK;
  case TFTP_EVENT_OACK:
    state->block = 1;
    break;
  case TFTP_EVENT_TIMEOUT:
    iVar9 = state->retries + 1;
    state->retries = iVar9;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Timeout waiting for block %d ACK.  Retries = %d",
                 (ulong)(*(int *)&state->block + 1U & 0xffff));
      iVar9 = state->retries;
    }
    if (state->retry_max < iVar9) {
      state->error = TFTP_ERR_TIMEOUT;
      goto LAB_00157854;
    }
    sVar6 = sendto(state->sockfd,(state->spacket).data,(long)state->sbytes + 4,0x4000,
                   (sockaddr *)&state->remote_addr,state->remote_addrlen);
    if (sVar6 < 0) goto LAB_00157a6e;
    size = (data->req).writebytecount;
    goto LAB_001579d2;
  default:
    Curl_failf(data,"tftp_tx: internal error, event: %i");
    return CURLE_OK;
  }
  state->retries = 0;
  *(state->spacket).data = '\0';
  (state->spacket).data[1] = '\x03';
  uVar1 = state->block;
  (state->spacket).data[2] = (uchar)(uVar1 >> 8);
  (state->spacket).data[3] = (uchar)uVar1;
  if (state->block < 2) {
    iVar9 = state->blksize;
  }
  else {
    iVar9 = state->blksize;
    if (state->sbytes < iVar9) {
LAB_00157854:
      state->state = TFTP_STATE_FIN;
      return CURLE_OK;
    }
  }
  state->sbytes = 0;
  buf = (state->spacket).data + 4;
  lVar10 = 0;
  do {
    CVar4 = Curl_client_read(data,(char *)buf,(long)(iVar9 - (int)lVar10),&cb,&eos);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    lVar10 = (long)(int)cb + (long)state->sbytes;
    state->sbytes = (int)lVar10;
    if (cb == 0) break;
    buf = buf + cb;
    iVar9 = state->blksize;
  } while ((int)lVar10 < iVar9);
  sVar6 = sendto(state->sockfd,(state->spacket).data,lVar10 + 4,0x4000,
                 (sockaddr *)&state->remote_addr,state->remote_addrlen);
  if (sVar6 < 0) {
LAB_00157a6e:
    piVar7 = __errno_location();
    pcVar8 = Curl_strerror(*piVar7,buffer,0x100);
    Curl_failf(data,"%s",pcVar8);
    return CURLE_SEND_ERROR;
  }
  size = (long)state->sbytes + (data->req).writebytecount;
  (data->req).writebytecount = size;
LAB_001579d2:
  Curl_pgrsSetUploadCounter(data,size);
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_tx(struct tftp_state_data *state, tftp_event_t event)
{
  struct Curl_easy *data = state->data;
  ssize_t sbytes;
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  size_t cb; /* Bytes currently read */
  char buffer[STRERROR_LEN];
  char *bufptr;
  bool eos;

  switch(event) {

  case TFTP_EVENT_ACK:
  case TFTP_EVENT_OACK:
    if(event == TFTP_EVENT_ACK) {
      /* Ack the packet */
      int rblock = getrpacketblock(&state->rpacket);

      if(rblock != state->block &&
         /* There is a bug in tftpd-hpa that causes it to send us an ack for
          * 65535 when the block number wraps to 0. So when we are expecting
          * 0, also accept 65535. See
          * https://www.syslinux.org/archives/2010-September/015612.html
          * */
         !(state->block == 0 && rblock == 65535)) {
        /* This is not the expected block. Log it and up the retry counter */
        infof(data, "Received ACK for block %d, expecting %d",
              rblock, state->block);
        state->retries++;
        /* Bail out if over the maximum */
        if(state->retries > state->retry_max) {
          failf(data, "tftp_tx: giving up waiting for block %d ack",
                state->block);
          result = CURLE_SEND_ERROR;
        }
        else {
          /* Re-send the data packet */
          sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                          4 + (SEND_TYPE_ARG3)state->sbytes, SEND_4TH_ARG,
                          (struct sockaddr *)&state->remote_addr,
                          state->remote_addrlen);
          /* Check all sbytes were sent */
          if(sbytes < 0) {
            failf(data, "%s", Curl_strerror(SOCKERRNO,
                                            buffer, sizeof(buffer)));
            result = CURLE_SEND_ERROR;
          }
        }

        return result;
      }
      /* This is the expected packet. Reset the counters and send the next
         block */
      state->rx_time = time(NULL);
      state->block++;
    }
    else
      state->block = 1; /* first data block is 1 when using OACK */

    state->retries = 0;
    setpacketevent(&state->spacket, TFTP_EVENT_DATA);
    setpacketblock(&state->spacket, state->block);
    if(state->block > 1 && state->sbytes < state->blksize) {
      state->state = TFTP_STATE_FIN;
      return CURLE_OK;
    }

    /* TFTP considers data block size < 512 bytes as an end of session. So
     * in some cases we must wait for additional data to build full (512 bytes)
     * data block.
     * */
    state->sbytes = 0;
    bufptr = (char *)state->spacket.data + 4;
    do {
      result = Curl_client_read(data, bufptr, state->blksize - state->sbytes,
                                &cb, &eos);
      if(result)
        return result;
      state->sbytes += (int)cb;
      bufptr += cb;
    } while(state->sbytes < state->blksize && cb);

    sbytes = sendto(state->sockfd, (void *) state->spacket.data,
                    4 + (SEND_TYPE_ARG3)state->sbytes, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    /* Check all sbytes were sent */
    if(sbytes < 0) {
      failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      return CURLE_SEND_ERROR;
    }
    /* Update the progress meter */
    k->writebytecount += state->sbytes;
    Curl_pgrsSetUploadCounter(data, k->writebytecount);
    break;

  case TFTP_EVENT_TIMEOUT:
    /* Increment the retry counter and log the timeout */
    state->retries++;
    infof(data, "Timeout waiting for block %d ACK. "
          " Retries = %d", NEXT_BLOCKNUM(state->block), state->retries);
    /* Decide if we have had enough */
    if(state->retries > state->retry_max) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
    }
    else {
      /* Re-send the data packet */
      sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                      4 + (SEND_TYPE_ARG3)state->sbytes, SEND_4TH_ARG,
                      (struct sockaddr *)&state->remote_addr,
                      state->remote_addrlen);
      /* Check all sbytes were sent */
      if(sbytes < 0) {
        failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
        return CURLE_SEND_ERROR;
      }
      /* since this was a re-send, we remain at the still byte position */
      Curl_pgrsSetUploadCounter(data, k->writebytecount);
    }
    break;

  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    setpacketevent(&state->spacket, TFTP_EVENT_ERROR);
    setpacketblock(&state->spacket, state->block);
    (void)sendto(state->sockfd, (void *)state->spacket.data, 4, SEND_4TH_ARG,
                 (struct sockaddr *)&state->remote_addr,
                 state->remote_addrlen);
    /* do not bother with the return code, but if the socket is still up we
     * should be a good TFTP client and let the server know we are done */
    state->state = TFTP_STATE_FIN;
    break;

  default:
    failf(data, "tftp_tx: internal error, event: %i", (int)(event));
    break;
  }

  return result;
}